

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_locale.h
# Opt level: O0

wstring * to<wchar_t>(string *utf8)

{
  wchar_t wVar1;
  long lVar2;
  wstring *in_RDI;
  uint prev;
  uint point;
  uint i;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *out;
  uint *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  
  std::__cxx11::wstring::wstring(in_RDI);
  while (lVar2 = std::__cxx11::string::size(), lVar2 != 0) {
    wVar1 = utf8_next(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::__cxx11::wstring::operator+=(in_RDI,wVar1);
  }
  return in_RDI;
}

Assistant:

std::basic_string<Char> to(std::string const &utf8)
{
    std::basic_string<Char> out;
    unsigned i=0;
    while(i<utf8.size()) {
        unsigned point;
        unsigned prev=i;
        point = utf8_next(utf8,i);
        if(sizeof(Char)==1 && point > 255) {
            std::ostringstream ss;
            ss << "Can't convert codepoint U" << std::hex << point <<"(" <<std::string(utf8.begin()+prev,utf8.begin()+i)<<") to Latin1";
            throw booster::runtime_error(ss.str());
        }
        else if(sizeof(Char)==2 && point >0xFFFF) { // Deal with surragates
            point-=0x10000;
            out+=static_cast<Char>(0xD800 | (point>>10));
            out+=static_cast<Char>(0xDC00 | (point & 0x3FF));
            continue;
        }
        out+=static_cast<Char>(point);
    }
    return out;
}